

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O1

void * mspace_malloc(mspace msp,size_t bytes)

{
  undefined1 (*pauVar1) [16];
  ulong *puVar2;
  byte *pbVar3;
  undefined1 (*pauVar4) [16];
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  size_t dvs;
  ulong uVar12;
  void *pvVar13;
  undefined1 (*pauVar14) [16];
  int *piVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  undefined8 *puVar19;
  ulong *puVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  uint uVar23;
  undefined8 *puVar24;
  char *pcVar25;
  undefined8 *puVar26;
  ulong uVar27;
  undefined8 *puVar28;
  long lVar29;
  msegmentptr sp;
  ulong *puVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  ulong nb;
  undefined8 *unaff_R15;
  
  if (bytes < 0xe9) {
    nb = 0x20;
    if (0x16 < bytes) {
      nb = (ulong)((int)bytes + 0x17U & 0x1f0);
    }
    uVar18 = (uint)(nb >> 3);
    uVar11 = *msp;
    uVar17 = uVar11 >> (uVar18 & 0x1f);
    if ((uVar17 & 3) != 0) {
      uVar18 = (uVar17 & 1 | uVar18) ^ 1;
      uVar12 = (long)msp + (ulong)(uVar18 << 4) + 0x48;
      lVar29 = *(long *)(uVar12 + 0x10);
      uVar16 = *(ulong *)(lVar29 + 0x10);
      if (uVar12 == uVar16) {
        *(uint *)msp = uVar11 & ~(1 << (uVar18 & 0x1f));
      }
      else {
        if ((uVar16 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar16 + 0x18) != lVar29))
        goto LAB_0012ff24;
        *(ulong *)(uVar16 + 0x18) = uVar12;
        *(ulong *)(uVar12 + 0x10) = uVar16;
      }
      unaff_R15 = (undefined8 *)(lVar29 + 0x10);
      *(ulong *)(lVar29 + 8) = (ulong)(uVar18 << 3) + 3;
      pbVar3 = (byte *)(lVar29 + 8 + (ulong)(uVar18 << 3));
      *pbVar3 = *pbVar3 | 1;
      goto LAB_0012f330;
    }
    uVar12 = *(ulong *)((long)msp + 8);
    bVar9 = true;
    if (uVar12 < nb) {
      if (uVar11 >> (uVar18 & 0x1f) != 0) {
        uVar23 = 2 << (uVar18 & 0x1f);
        uVar5 = 0;
        for (uVar18 = (-uVar23 | uVar23) & uVar17 << (uVar18 & 0x1f); (uVar18 & 1) == 0;
            uVar18 = uVar18 >> 1 | 0x80000000) {
          uVar5 = uVar5 + 1;
        }
        uVar16 = (long)msp + (ulong)(uVar5 << 4) + 0x48;
        lVar29 = *(long *)(uVar16 + 0x10);
        uVar32 = *(ulong *)(lVar29 + 0x10);
        if (uVar16 == uVar32) {
          *(uint *)msp = uVar11 & ~(1 << (uVar5 & 0x1f));
        }
        else {
          if ((uVar32 < *(ulong *)((long)msp + 0x18)) || (*(long *)(uVar32 + 0x18) != lVar29))
          goto LAB_0012ff24;
          *(ulong *)(uVar32 + 0x18) = uVar16;
          *(ulong *)(uVar16 + 0x10) = uVar32;
        }
        unaff_R15 = (undefined8 *)(lVar29 + 0x10);
        uVar32 = (ulong)(uVar5 << 3);
        uVar16 = uVar32 - nb;
        if (uVar16 < 0x20) {
          *(ulong *)(lVar29 + 8) = uVar32 | 3;
          pbVar3 = (byte *)(lVar29 + 8 + uVar32);
          *pbVar3 = *pbVar3 | 1;
        }
        else {
          *(ulong *)(lVar29 + 8) = nb | 3;
          *(ulong *)(lVar29 + 8 + nb) = uVar16 | 1;
          *(ulong *)(lVar29 + uVar32) = uVar16;
          if (uVar12 != 0) {
            lVar21 = *(long *)((long)msp + 0x20);
            uVar11 = (uint)(uVar12 >> 3);
            uVar12 = (long)msp + (ulong)(uVar11 * 2) * 8 + 0x48;
            if ((*msp >> (uVar11 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << (uVar11 & 0x1f);
              uVar32 = uVar12;
            }
            else {
              uVar32 = *(ulong *)(uVar12 + 0x10);
              if (*(ulong *)(uVar12 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
            }
            *(long *)(uVar12 + 0x10) = lVar21;
            *(long *)(uVar32 + 0x18) = lVar21;
            *(ulong *)(lVar21 + 0x10) = uVar32;
            *(ulong *)(lVar21 + 0x18) = uVar12;
          }
          *(ulong *)((long)msp + 8) = uVar16;
          *(ulong *)((long)msp + 0x20) = lVar29 + nb;
        }
        goto LAB_0012f330;
      }
      uVar18 = *(uint *)((long)msp + 4);
      if (uVar18 != 0) {
        uVar17 = 0;
        for (uVar5 = uVar18; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
          uVar17 = uVar17 + 1;
        }
        puVar24 = *(undefined8 **)((long)msp + (ulong)uVar17 * 8 + 600);
        uVar16 = (puVar24[1] & 0xfffffffffffffff8) - nb;
        puVar19 = puVar24;
        while( true ) {
          puVar26 = (undefined8 *)puVar24[4];
          if (puVar26 == (undefined8 *)0x0) {
            puVar26 = (undefined8 *)puVar24[5];
          }
          if (puVar26 == (undefined8 *)0x0) break;
          uVar32 = (puVar26[1] & 0xfffffffffffffff8) - nb;
          puVar24 = puVar26;
          if (uVar32 < uVar16) {
            uVar16 = uVar32;
            puVar19 = puVar26;
          }
        }
        puVar24 = *(undefined8 **)((long)msp + 0x18);
        if (puVar19 < puVar24) goto LAB_0012ff24;
        puVar26 = (undefined8 *)puVar19[3];
        uVar32 = puVar19[6];
        if (puVar26 == puVar19) {
          puVar26 = (undefined8 *)puVar19[5];
          if (puVar26 != (undefined8 *)0x0) {
            puVar28 = puVar19 + 5;
LAB_0012fe0b:
            do {
              if (puVar26[5] == 0) {
                if (puVar26[4] == 0) goto code_r0x0012fe1f;
                puVar28 = puVar26 + 4;
              }
              else {
                puVar28 = puVar26 + 5;
              }
              puVar26 = (undefined8 *)*puVar28;
            } while( true );
          }
          puVar26 = (undefined8 *)puVar19[4];
          if (puVar26 != (undefined8 *)0x0) {
            puVar28 = puVar19 + 4;
            goto LAB_0012fe0b;
          }
          puVar26 = (undefined8 *)0x0;
        }
        else {
          puVar28 = (undefined8 *)puVar19[2];
          if (((puVar28 < puVar24) || ((undefined8 *)puVar28[3] != puVar19)) ||
             ((undefined8 *)puVar26[2] != puVar19)) goto LAB_0012ff24;
          puVar28[3] = puVar26;
          puVar26[2] = puVar28;
        }
        goto LAB_0012fe2f;
      }
    }
    unaff_R15 = (undefined8 *)0x0;
    goto LAB_0012f45d;
  }
  nb = 0xffffffffffffffff;
  if (bytes < 0xffffffffffffff80) {
    nb = bytes + 0x17 & 0xfffffffffffffff0;
    uVar11 = *(uint *)((long)msp + 4);
    if (uVar11 != 0) {
      uVar18 = (uint)(bytes + 0x17 >> 8);
      if (uVar18 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = 0x1f;
        if (uVar18 < 0x10000) {
          uVar12 = (ulong)(((uint)(nb >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar18)) & 0x3f)) & 1)
                           + LZCOUNT(uVar18) * 2 ^ 0x3e);
        }
      }
      uVar16 = -nb;
      puVar24 = *(undefined8 **)((long)msp + uVar12 * 8 + 600);
      unaff_R15 = (undefined8 *)0x0;
      if (puVar24 == (undefined8 *)0x0) {
        puVar24 = (undefined8 *)0x0;
      }
      else {
        puVar19 = (undefined8 *)(ulong)(byte)(0x39 - (char)(uVar12 >> 1));
        if ((uint)uVar12 == 0x1f) {
          puVar19 = unaff_R15;
        }
        lVar29 = nb << ((ulong)puVar19 & 0x3f);
        puVar19 = (undefined8 *)0x0;
        do {
          uVar32 = (puVar24[1] & 0xfffffffffffffff8) - nb;
          if ((uVar32 < uVar16) && (uVar16 = uVar32, unaff_R15 = puVar24, uVar32 == 0)) {
            bVar9 = false;
            uVar16 = 0;
          }
          else {
            puVar26 = (undefined8 *)puVar24[5];
            puVar24 = (undefined8 *)puVar24[4 - (lVar29 >> 0x3f)];
            puVar28 = puVar26;
            if (puVar26 == puVar24) {
              puVar28 = puVar19;
            }
            if (puVar26 != (undefined8 *)0x0) {
              puVar19 = puVar28;
            }
            if (puVar24 == (undefined8 *)0x0) {
              bVar9 = false;
              puVar24 = puVar19;
            }
            else {
              lVar29 = lVar29 * 2;
              bVar9 = true;
            }
          }
        } while (bVar9);
      }
      if (puVar24 == (undefined8 *)0x0 && unaff_R15 == (undefined8 *)0x0) {
        uVar18 = 2 << ((uint)uVar12 & 0x1f);
        uVar18 = (-uVar18 | uVar18) & uVar11;
        if (uVar18 == 0) {
          puVar24 = (undefined8 *)0x0;
        }
        else {
          uVar17 = 0;
          for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x80000000) {
            uVar17 = uVar17 + 1;
          }
          puVar24 = *(undefined8 **)((long)msp + (ulong)uVar17 * 8 + 600);
        }
      }
      while (puVar19 = puVar24, puVar19 != (undefined8 *)0x0) {
        uVar12 = (puVar19[1] & 0xfffffffffffffff8) - nb;
        if (uVar12 < uVar16) {
          unaff_R15 = puVar19;
          uVar16 = uVar12;
        }
        puVar24 = (undefined8 *)puVar19[4];
        if ((undefined8 *)puVar19[4] == (undefined8 *)0x0) {
          puVar24 = (undefined8 *)puVar19[5];
        }
      }
      if ((unaff_R15 != (undefined8 *)0x0) && (uVar16 < *(long *)((long)msp + 8) - nb)) {
        puVar24 = *(undefined8 **)((long)msp + 0x18);
        if (unaff_R15 < puVar24) goto LAB_0012ff24;
        if (0 < (long)nb) {
          puVar19 = (undefined8 *)unaff_R15[3];
          uVar12 = unaff_R15[6];
          if (puVar19 == unaff_R15) {
            puVar19 = (undefined8 *)unaff_R15[5];
            if (puVar19 != (undefined8 *)0x0) {
              puVar26 = unaff_R15 + 5;
LAB_0012fa24:
              do {
                if (puVar19[5] == 0) {
                  if (puVar19[4] == 0) goto code_r0x0012fa38;
                  puVar26 = puVar19 + 4;
                }
                else {
                  puVar26 = puVar19 + 5;
                }
                puVar19 = (undefined8 *)*puVar26;
              } while( true );
            }
            puVar19 = (undefined8 *)unaff_R15[4];
            if (puVar19 != (undefined8 *)0x0) {
              puVar26 = unaff_R15 + 4;
              goto LAB_0012fa24;
            }
            puVar19 = (undefined8 *)0x0;
          }
          else {
            puVar26 = (undefined8 *)unaff_R15[2];
            if (((puVar26 < puVar24) || ((undefined8 *)puVar26[3] != unaff_R15)) ||
               ((undefined8 *)puVar19[2] != unaff_R15)) goto LAB_0012ff24;
            puVar26[3] = puVar19;
            puVar19[2] = puVar26;
          }
          goto LAB_0012fa48;
        }
        goto LAB_0012fdd7;
      }
      unaff_R15 = (undefined8 *)0x0;
      goto LAB_0012fde0;
    }
  }
  goto LAB_0012f466;
code_r0x0012fe1f:
  if (puVar28 < puVar24) goto LAB_0012ff24;
  *puVar28 = 0;
LAB_0012fe2f:
  if (uVar32 != 0) {
    uVar17 = *(uint *)(puVar19 + 7);
    if (puVar19 == *(undefined8 **)((long)msp + (ulong)uVar17 * 8 + 600)) {
      *(undefined8 **)((long)msp + (ulong)uVar17 * 8 + 600) = puVar26;
      if (puVar26 == (undefined8 *)0x0) {
        *(uint *)((long)msp + 4) = uVar18 & ~(1 << (uVar17 & 0x1f));
        goto LAB_0012fe76;
      }
    }
    else {
      if (uVar32 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
      if (*(undefined8 **)(uVar32 + 0x20) == puVar19) {
        *(undefined8 **)(uVar32 + 0x20) = puVar26;
      }
      else {
        *(undefined8 **)(uVar32 + 0x28) = puVar26;
      }
LAB_0012fe76:
      if (puVar26 == (undefined8 *)0x0) goto LAB_0012febd;
    }
    puVar24 = *(undefined8 **)((long)msp + 0x18);
    if (puVar26 < puVar24) goto LAB_0012ff24;
    puVar26[6] = uVar32;
    puVar28 = (undefined8 *)puVar19[4];
    if (puVar28 != (undefined8 *)0x0) {
      if (puVar28 < puVar24) goto LAB_0012ff24;
      puVar26[4] = puVar28;
      puVar28[6] = puVar26;
    }
    uVar32 = puVar19[5];
    if (uVar32 != 0) {
      if (uVar32 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
      puVar26[5] = uVar32;
      *(undefined8 **)(uVar32 + 0x30) = puVar26;
    }
  }
LAB_0012febd:
  if (uVar16 < 0x20) {
    puVar19[1] = uVar16 + nb | 3;
    pbVar3 = (byte *)((long)puVar19 + uVar16 + nb + 8);
    *pbVar3 = *pbVar3 | 1;
  }
  else {
    puVar19[1] = nb | 3;
    *(ulong *)((long)puVar19 + nb + 8) = uVar16 | 1;
    *(ulong *)((long)puVar19 + nb + uVar16) = uVar16;
    if (uVar12 != 0) {
      lVar29 = *(long *)((long)msp + 0x20);
      uVar18 = (uint)(uVar12 >> 3);
      uVar12 = (long)msp + (ulong)(uVar18 * 2) * 8 + 0x48;
      if ((uVar11 >> (uVar18 & 0x1f) & 1) == 0) {
        *(uint *)msp = 1 << (uVar18 & 0x1f) | uVar11;
        uVar32 = uVar12;
      }
      else {
        uVar32 = *(ulong *)(uVar12 + 0x10);
        if (*(ulong *)(uVar12 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
      }
      *(long *)(uVar12 + 0x10) = lVar29;
      *(long *)(uVar32 + 0x18) = lVar29;
      *(ulong *)(lVar29 + 0x10) = uVar32;
      *(ulong *)(lVar29 + 0x18) = uVar12;
    }
    *(ulong *)((long)msp + 8) = uVar16;
    *(ulong *)((long)msp + 0x20) = (long)puVar19 + nb;
  }
  unaff_R15 = puVar19 + 2;
LAB_0012f330:
  bVar9 = false;
LAB_0012f45d:
  if (!bVar9) {
    return unaff_R15;
  }
  goto LAB_0012f466;
code_r0x0012fa38:
  if (puVar26 < puVar24) goto LAB_0012ff24;
  *puVar26 = 0;
LAB_0012fa48:
  if (uVar12 != 0) {
    uVar18 = *(uint *)(unaff_R15 + 7);
    if (unaff_R15 == *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600)) {
      *(undefined8 **)((long)msp + (ulong)uVar18 * 8 + 600) = puVar19;
      if (puVar19 == (undefined8 *)0x0) {
        *(uint *)((long)msp + 4) = uVar11 & ~(1 << (uVar18 & 0x1f));
        goto LAB_0012fa87;
      }
    }
    else {
      if (uVar12 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
      if (*(undefined8 **)(uVar12 + 0x20) == unaff_R15) {
        *(undefined8 **)(uVar12 + 0x20) = puVar19;
      }
      else {
        *(undefined8 **)(uVar12 + 0x28) = puVar19;
      }
LAB_0012fa87:
      if (puVar19 == (undefined8 *)0x0) goto LAB_0012fad2;
    }
    puVar24 = *(undefined8 **)((long)msp + 0x18);
    if (puVar19 < puVar24) goto LAB_0012ff24;
    puVar19[6] = uVar12;
    puVar26 = (undefined8 *)unaff_R15[4];
    if (puVar26 != (undefined8 *)0x0) {
      if (puVar26 < puVar24) goto LAB_0012ff24;
      puVar19[4] = puVar26;
      puVar26[6] = puVar19;
    }
    uVar12 = unaff_R15[5];
    if (uVar12 != 0) {
      if (uVar12 < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
      puVar19[5] = uVar12;
      *(undefined8 **)(uVar12 + 0x30) = puVar19;
    }
  }
LAB_0012fad2:
  if (uVar16 < 0x20) {
    unaff_R15[1] = uVar16 + nb | 3;
    pbVar3 = (byte *)((long)unaff_R15 + uVar16 + nb + 8);
    *pbVar3 = *pbVar3 | 1;
  }
  else {
    uVar12 = (long)unaff_R15 + nb;
    unaff_R15[1] = nb | 3;
    *(ulong *)((long)unaff_R15 + nb + 8) = uVar16 | 1;
    *(ulong *)(uVar12 + uVar16) = uVar16;
    if (uVar16 < 0x100) {
      uVar32 = (long)msp + (uVar16 >> 3) * 0x10 + 0x48;
      uVar11 = (uint)(uVar16 >> 3);
      if ((*msp >> (uVar11 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << (uVar11 & 0x1f);
        uVar16 = uVar32;
      }
      else {
        uVar16 = *(ulong *)(uVar32 + 0x10);
        if (*(ulong *)(uVar32 + 0x10) < *(ulong *)((long)msp + 0x18)) goto LAB_0012ff24;
      }
      *(ulong *)(uVar32 + 0x10) = uVar12;
      *(ulong *)(uVar16 + 0x18) = uVar12;
      *(ulong *)(uVar12 + 0x10) = uVar16;
      *(ulong *)(uVar12 + 0x18) = uVar32;
    }
    else {
      uVar11 = (uint)(uVar16 >> 8);
      if (uVar11 == 0) {
        uVar18 = 0;
      }
      else {
        uVar18 = 0x1f;
        if (uVar11 < 0x10000) {
          uVar18 = ((uint)(uVar16 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar11)) & 0x3f)) & 1) +
                   LZCOUNT(uVar11) * 2 ^ 0x3e;
        }
      }
      puVar2 = (ulong *)((long)msp + (ulong)uVar18 * 8 + 600);
      *(uint *)(uVar12 + 0x38) = uVar18;
      *(undefined8 *)(uVar12 + 0x20) = 0;
      *(undefined8 *)(uVar12 + 0x28) = 0;
      if ((*(uint *)((long)msp + 4) >> (uVar18 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar18 & 0x1f);
        *puVar2 = uVar12;
        *(ulong **)(uVar12 + 0x30) = puVar2;
        *(ulong *)(uVar12 + 0x18) = uVar12;
        *(ulong *)(uVar12 + 0x10) = uVar12;
      }
      else {
        uVar32 = *puVar2;
        uVar27 = (ulong)(byte)(0x39 - (char)(uVar18 >> 1));
        if (uVar18 == 0x1f) {
          uVar27 = 0;
        }
        lVar29 = uVar16 << (uVar27 & 0x3f);
        do {
          if ((*(ulong *)(uVar32 + 8) & 0xfffffffffffffff8) == uVar16) {
            if ((uVar32 < *(ulong *)((long)msp + 0x18)) ||
               (uVar16 = *(ulong *)(uVar32 + 0x10), uVar16 < *(ulong *)((long)msp + 0x18)))
            goto LAB_0012ff24;
            *(ulong *)(uVar16 + 0x18) = uVar12;
            *(ulong *)(uVar32 + 0x10) = uVar12;
            *(ulong *)(uVar12 + 0x10) = uVar16;
            *(ulong *)(uVar12 + 0x18) = uVar32;
            *(undefined8 *)(uVar12 + 0x30) = 0;
            break;
          }
          uVar27 = *(ulong *)(uVar32 + 0x20 + (lVar29 >> 0x3f) * -8);
          uVar10 = uVar27;
          if (uVar27 == 0) {
            puVar2 = (ulong *)(uVar32 + 0x20 + (lVar29 >> 0x3f) * -8);
            if (puVar2 < *(ulong **)((long)msp + 0x18)) goto LAB_0012ff24;
            *puVar2 = uVar12;
            *(ulong *)(uVar12 + 0x30) = uVar32;
            *(ulong *)(uVar12 + 0x18) = uVar12;
            *(ulong *)(uVar12 + 0x10) = uVar12;
            uVar10 = uVar32;
          }
          uVar32 = uVar10;
          lVar29 = lVar29 * 2;
        } while (uVar27 != 0);
      }
    }
  }
  unaff_R15 = unaff_R15 + 2;
LAB_0012fdd7:
  if ((long)nb < 1) goto LAB_0012ff24;
LAB_0012fde0:
  if (unaff_R15 != (undefined8 *)0x0) {
    return unaff_R15;
  }
LAB_0012f466:
  uVar12 = *(ulong *)((long)msp + 8);
  uVar16 = uVar12 - nb;
  if (uVar12 < nb) {
    uVar12 = *(ulong *)((long)msp + 0x10) - nb;
    if (*(ulong *)((long)msp + 0x10) < nb || uVar12 == 0) {
      if (mparams.magic == 0) {
        init_mparams();
      }
      if ((((*(byte *)((long)msp + 0x370) & 1) != 0) && (mparams.mmap_threshold <= nb)) &&
         (*(long *)((long)msp + 0x10) != 0)) {
        uVar12 = -mparams.page_size & nb + 0x3e + mparams.page_size;
        if (((*(ulong *)((long)msp + 0x368) == 0) ||
            (uVar16 = *(ulong *)((long)msp + 0x358) + uVar12,
            uVar16 <= *(ulong *)((long)msp + 0x368) && *(ulong *)((long)msp + 0x358) < uVar16)) &&
           (nb < uVar12)) {
          unaff_R15 = (undefined8 *)0x0;
          pvVar13 = mmap((void *)0x0,uVar12,3,0x22,-1,0);
          if (pvVar13 != (void *)0xffffffffffffffff) {
            uVar16 = (ulong)(-(int)pvVar13 - 0x10U & 0xf);
            *(ulong *)((long)pvVar13 + uVar16) = uVar16;
            *(ulong *)((long)pvVar13 + uVar16 + 8) = (uVar12 - uVar16) + -0x20;
            *(undefined8 *)((long)pvVar13 + (uVar12 - uVar16) + -0x18 + uVar16) = 0xb;
            *(undefined8 *)((long)pvVar13 + (uVar12 - 0x10)) = 0;
            if ((*(void **)((long)msp + 0x18) == (void *)0x0) ||
               (pvVar13 < *(void **)((long)msp + 0x18))) {
              *(void **)((long)msp + 0x18) = pvVar13;
            }
            uVar12 = uVar12 + *(long *)((long)msp + 0x358);
            *(ulong *)((long)msp + 0x358) = uVar12;
            if (*(ulong *)((long)msp + 0x360) < uVar12) {
              *(ulong *)((long)msp + 0x360) = uVar12;
            }
            unaff_R15 = (undefined8 *)((long)pvVar13 + uVar16 + 0x10);
          }
          if (pvVar13 == (void *)0xffffffffffffffff) goto LAB_0012f5da;
        }
        else {
LAB_0012f5da:
          unaff_R15 = (undefined8 *)0x0;
        }
        if (unaff_R15 != (undefined8 *)0x0) {
          return unaff_R15;
        }
      }
      uVar12 = -mparams.granularity & nb + 0x5f + mparams.granularity;
      if (uVar12 <= nb) {
        return (void *)0x0;
      }
      if ((*(ulong *)((long)msp + 0x368) != 0) &&
         (uVar16 = *(ulong *)((long)msp + 0x358) + uVar12,
         *(ulong *)((long)msp + 0x368) < uVar16 || uVar16 <= *(ulong *)((long)msp + 0x358))) {
        return (void *)0x0;
      }
      pauVar14 = (undefined1 (*) [16])mmap((void *)0x0,uVar12,3,0x22,-1,0);
      if (pauVar14 == (undefined1 (*) [16])0xffffffffffffffff) {
LAB_001300ce:
        piVar15 = __errno_location();
        *piVar15 = 0xc;
        return (void *)0x0;
      }
      uVar16 = *(long *)((long)msp + 0x358) + uVar12;
      *(ulong *)((long)msp + 0x358) = uVar16;
      if (*(ulong *)((long)msp + 0x360) < uVar16) {
        *(ulong *)((long)msp + 0x360) = uVar16;
      }
      pauVar4 = *(undefined1 (**) [16])((long)msp + 0x28);
      uVar11 = (uint)(pauVar14 != (undefined1 (*) [16])0xffffffffffffffff);
      if (pauVar4 == (undefined1 (*) [16])0x0) {
        if ((*(undefined1 (**) [16])((long)msp + 0x18) == (undefined1 (*) [16])0x0) ||
           (pauVar14 < *(undefined1 (**) [16])((long)msp + 0x18))) {
          *(undefined1 (**) [16])((long)msp + 0x18) = pauVar14;
        }
        *(undefined1 (**) [16])((long)msp + 0x378) = pauVar14;
        *(ulong *)((long)msp + 0x380) = uVar12;
        *(uint *)((long)msp + 0x390) = uVar11;
        *(size_t *)((long)msp + 0x40) = mparams.magic;
        *(undefined8 *)((long)msp + 0x38) = 0xfff;
        lVar29 = (long)msp + 0x48;
        lVar21 = 0x20;
        do {
          *(long *)(lVar29 + 0x18) = lVar29;
          *(long *)(lVar29 + 0x10) = lVar29;
          lVar29 = lVar29 + 0x10;
          lVar21 = lVar21 + -1;
        } while (lVar21 != 0);
        uVar16 = *(ulong *)((long)msp + -8) & 0xfffffffffffffff8;
        lVar29 = (long)msp + (uVar16 - 0x10);
        uVar32 = (ulong)(-(int)lVar29 - 0x10U & 0xf);
        lVar21 = (long)msp + (uVar32 - 0x10) + uVar16;
        pcVar25 = (char *)((long)pauVar14 + ((uVar12 - lVar29) - uVar32) + -0x50);
        *(long *)((long)msp + 0x28) = lVar21;
        *(char **)((long)msp + 0x10) = pcVar25;
        *(ulong *)(lVar21 + 8) = (ulong)pcVar25 | 1;
        pcVar25 = pauVar14[-5] + uVar12 + 8;
        pcVar25[0] = 'P';
        pcVar25[1] = '\0';
        pcVar25[2] = '\0';
        pcVar25[3] = '\0';
        pcVar25[4] = '\0';
        pcVar25[5] = '\0';
        pcVar25[6] = '\0';
        pcVar25[7] = '\0';
        *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
      }
      else {
        puVar2 = (ulong *)((long)msp + 0x378);
        puVar20 = puVar2;
        do {
          pauVar22 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar20 + puVar20[1]);
          if (pauVar14 == pauVar22) {
            if ((((pauVar4 < pauVar22) && ((undefined1 (*) [16])*puVar20 <= pauVar4)) &&
                ((puVar20[3] & 8) == 0)) && ((puVar20[3] & 1) != 0)) {
              puVar20[1] = puVar20[1] + uVar12;
              lVar29 = uVar12 + *(long *)((long)msp + 0x10);
              uVar12 = (ulong)(-(int)pauVar4 - 0x10U & 0xf);
              uVar16 = lVar29 - uVar12;
              *(undefined1 **)((long)msp + 0x28) = *pauVar4 + uVar12;
              *(ulong *)((long)msp + 0x10) = uVar16;
              *(ulong *)(*pauVar4 + uVar12 + 8) = uVar16 | 1;
              pcVar25 = *pauVar4 + lVar29 + 8;
              pcVar25[0] = 'P';
              pcVar25[1] = '\0';
              pcVar25[2] = '\0';
              pcVar25[3] = '\0';
              pcVar25[4] = '\0';
              pcVar25[5] = '\0';
              pcVar25[6] = '\0';
              pcVar25[7] = '\0';
              *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
              bVar9 = true;
              goto LAB_001300b9;
            }
            break;
          }
          puVar20 = (ulong *)puVar20[2];
        } while (puVar20 != (ulong *)0x0);
        if (pauVar14 < *(undefined1 (**) [16])((long)msp + 0x18)) {
          *(undefined1 (**) [16])((long)msp + 0x18) = pauVar14;
        }
        puVar20 = puVar2;
        do {
          pcVar25 = (char *)*puVar20;
          puVar30 = puVar2;
          if (pcVar25 == *pauVar14 + uVar12) {
            if ((((uint)puVar20[3] & 8) == 0 & (byte)(uint)puVar20[3]) != 0) {
              *puVar20 = (ulong)pauVar14;
              puVar20[1] = puVar20[1] + uVar12;
              unaff_R15 = (undefined8 *)prepend_alloc((mstate)msp,(char *)pauVar14,pcVar25,nb);
              bVar9 = false;
              goto LAB_001300b9;
            }
            break;
          }
          puVar20 = (ulong *)puVar20[2];
        } while (puVar20 != (ulong *)0x0);
        for (; (pauVar4 < (undefined1 (*) [16])*puVar30 ||
               (pauVar22 = (undefined1 (*) [16])(*(undefined1 (*) [16])*puVar30 + puVar30[1]),
               pauVar22 <= pauVar4)); puVar30 = (ulong *)puVar30[2]) {
        }
        pauVar31 = (undefined1 (*) [16])(pauVar22[-6] + (ulong)(0x4fU - (int)pauVar22 & 0xf) + 1);
        if ((undefined1 (*) [16])(pauVar22[-6] + (ulong)(0x4fU - (int)pauVar22 & 0xf) + 1) <
            pauVar4 + 2) {
          pauVar31 = pauVar4;
        }
        uVar16 = (ulong)(-(int)pauVar14 - 0x10U & 0xf);
        uVar32 = (uVar12 - 0x50) - uVar16;
        *(undefined1 **)((long)msp + 0x28) = *pauVar14 + uVar16;
        *(ulong *)((long)msp + 0x10) = uVar32;
        *(ulong *)(*pauVar14 + uVar16 + 8) = uVar32 | 1;
        pcVar25 = pauVar14[-5] + uVar12 + 8;
        pcVar25[0] = 'P';
        pcVar25[1] = '\0';
        pcVar25[2] = '\0';
        pcVar25[3] = '\0';
        pcVar25[4] = '\0';
        pcVar25[5] = '\0';
        pcVar25[6] = '\0';
        pcVar25[7] = '\0';
        *(size_t *)((long)msp + 0x30) = mparams.trim_threshold;
        *(char *)((long)pauVar31 + 8) = '3';
        *(char *)((long)pauVar31 + 9) = '\0';
        *(char *)((long)pauVar31 + 10) = '\0';
        *(char *)((long)pauVar31 + 0xb) = '\0';
        *(char *)((long)pauVar31 + 0xc) = '\0';
        *(char *)((long)pauVar31 + 0xd) = '\0';
        *(char *)((long)pauVar31 + 0xe) = '\0';
        *(char *)((long)pauVar31 + 0xf) = '\0';
        uVar6 = *(undefined8 *)((long)msp + 0x380);
        uVar7 = *(undefined8 *)((long)msp + 0x388);
        uVar8 = *(undefined8 *)((long)msp + 0x390);
        *(ulong *)pauVar31[1] = *puVar2;
        *(undefined8 *)(pauVar31[1] + 8) = uVar6;
        *(undefined8 *)pauVar31[2] = uVar7;
        *(undefined8 *)(pauVar31[2] + 8) = uVar8;
        *(undefined1 (**) [16])((long)msp + 0x378) = pauVar14;
        *(ulong *)((long)msp + 0x380) = uVar12;
        *(uint *)((long)msp + 0x390) = uVar11;
        *(undefined1 (**) [16])((long)msp + 0x388) = pauVar31 + 1;
        pauVar14 = pauVar31 + 3;
        do {
          *(char *)((long)pauVar14 + 8) = '\v';
          *(char *)((long)pauVar14 + 9) = '\0';
          *(char *)((long)pauVar14 + 10) = '\0';
          *(char *)((long)pauVar14 + 0xb) = '\0';
          *(char *)((long)pauVar14 + 0xc) = '\0';
          *(char *)((long)pauVar14 + 0xd) = '\0';
          *(char *)((long)pauVar14 + 0xe) = '\0';
          *(char *)((long)pauVar14 + 0xf) = '\0';
          pauVar1 = pauVar14 + 1;
          pauVar14 = (undefined1 (*) [16])(*pauVar14 + 8);
        } while (pauVar1 < pauVar22);
        bVar9 = true;
        uVar12 = (long)pauVar31 - (long)pauVar4;
        if (uVar12 != 0) {
          (*pauVar31)[8] = (*pauVar31)[8] & 0xfe;
          *(ulong *)(*pauVar4 + 8) = uVar12 | 1;
          *(ulong *)*pauVar31 = uVar12;
          if (uVar12 < 0x100) {
            uVar16 = (long)msp + (uVar12 >> 3) * 0x10 + 0x48;
            uVar11 = (uint)(uVar12 >> 3);
            if ((*msp >> (uVar11 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << (uVar11 & 0x1f);
              uVar12 = uVar16;
            }
            else {
              uVar12 = *(ulong *)(uVar16 + 0x10);
              if (*(ulong *)(uVar16 + 0x10) < *(ulong *)((long)msp + 0x18)) {
LAB_0012ff24:
                abort();
              }
            }
            *(undefined1 (**) [16])(uVar16 + 0x10) = pauVar4;
            *(undefined1 (**) [16])(uVar12 + 0x18) = pauVar4;
            *(ulong *)pauVar4[1] = uVar12;
            *(ulong *)(pauVar4[1] + 8) = uVar16;
          }
          else {
            uVar11 = (uint)(uVar12 >> 8);
            if (uVar11 == 0) {
              uVar18 = 0;
            }
            else {
              uVar18 = 0x1f;
              if (uVar11 < 0x10000) {
                uVar18 = ((uint)(uVar12 >> ((ulong)(byte)(0x26 - (char)LZCOUNT(uVar11)) & 0x3f)) & 1
                         ) + LZCOUNT(uVar11) * 2 ^ 0x3e;
              }
            }
            puVar2 = (ulong *)((long)msp + (ulong)uVar18 * 8 + 600);
            *(uint *)(pauVar4[3] + 8) = uVar18;
            pauVar4[2] = ZEXT816(0) << 0x20;
            if ((*(uint *)((long)msp + 4) >> (uVar18 & 0x1f) & 1) == 0) {
              *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << (uVar18 & 0x1f);
              *puVar2 = (ulong)pauVar4;
              *(ulong **)pauVar4[3] = puVar2;
              *(undefined1 (**) [16])(pauVar4[1] + 8) = pauVar4;
              *(undefined1 (**) [16])pauVar4[1] = pauVar4;
            }
            else {
              uVar16 = *puVar2;
              uVar32 = (ulong)(byte)(0x39 - (char)(uVar18 >> 1));
              if (uVar18 == 0x1f) {
                uVar32 = 0;
              }
              lVar29 = uVar12 << (uVar32 & 0x3f);
              do {
                if ((*(ulong *)(uVar16 + 8) & 0xfffffffffffffff8) == uVar12) {
                  if ((uVar16 < *(ulong *)((long)msp + 0x18)) ||
                     (uVar12 = *(ulong *)(uVar16 + 0x10), uVar12 < *(ulong *)((long)msp + 0x18)))
                  goto LAB_0012ff24;
                  *(undefined1 (**) [16])(uVar12 + 0x18) = pauVar4;
                  *(undefined1 (**) [16])(uVar16 + 0x10) = pauVar4;
                  *(ulong *)pauVar4[1] = uVar12;
                  *(ulong *)(pauVar4[1] + 8) = uVar16;
                  *(char *)((long)(pauVar4 + 3) + 0) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 1) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 2) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 3) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 4) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 5) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 6) = '\0';
                  *(char *)((long)(pauVar4 + 3) + 7) = '\0';
                  break;
                }
                uVar32 = *(ulong *)(uVar16 + 0x20 + (lVar29 >> 0x3f) * -8);
                uVar27 = uVar32;
                if (uVar32 == 0) {
                  puVar2 = (ulong *)(uVar16 + 0x20 + (lVar29 >> 0x3f) * -8);
                  if (puVar2 < *(ulong **)((long)msp + 0x18)) goto LAB_0012ff24;
                  *puVar2 = (ulong)pauVar4;
                  *(ulong *)pauVar4[3] = uVar16;
                  *(undefined1 (**) [16])(pauVar4[1] + 8) = pauVar4;
                  *(undefined1 (**) [16])pauVar4[1] = pauVar4;
                  uVar27 = uVar16;
                }
                uVar16 = uVar27;
                lVar29 = lVar29 * 2;
              } while (uVar32 != 0);
            }
          }
        }
LAB_001300b9:
        if (!bVar9) {
          return unaff_R15;
        }
      }
      uVar12 = *(ulong *)((long)msp + 0x10) - nb;
      if (*(ulong *)((long)msp + 0x10) < nb || uVar12 == 0) goto LAB_001300ce;
    }
    *(ulong *)((long)msp + 0x10) = uVar12;
    lVar29 = *(long *)((long)msp + 0x28);
    *(ulong *)((long)msp + 0x28) = lVar29 + nb;
    *(ulong *)(lVar29 + 8 + nb) = uVar12 | 1;
  }
  else {
    lVar29 = *(long *)((long)msp + 0x20);
    if (uVar16 < 0x20) {
      *(undefined8 *)((long)msp + 8) = 0;
      *(undefined8 *)((long)msp + 0x20) = 0;
      *(ulong *)(lVar29 + 8) = uVar12 | 3;
      pbVar3 = (byte *)(lVar29 + 8 + uVar12);
      *pbVar3 = *pbVar3 | 1;
      goto LAB_0012f5ff;
    }
    *(ulong *)((long)msp + 0x20) = lVar29 + nb;
    *(ulong *)((long)msp + 8) = uVar16;
    *(ulong *)(lVar29 + 8 + nb) = uVar16 | 1;
    *(ulong *)(lVar29 + uVar12) = uVar16;
  }
  *(ulong *)(lVar29 + 8) = nb | 3;
LAB_0012f5ff:
  return (void *)(lVar29 + 0x10);
}

Assistant:

void* mspace_malloc(mspace msp, size_t bytes) {
  mstate ms = (mstate)msp;
  if (!ok_magic(ms)) {
    USAGE_ERROR_ACTION(ms,ms);
    return 0;
  }
  if (!PREACTION(ms)) {
    void* mem;
    size_t nb;
    if (bytes <= MAX_SMALL_REQUEST) {
      bindex_t idx;
      binmap_t smallbits;
      nb = (bytes < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(bytes);
      idx = small_index(nb);
      smallbits = ms->smallmap >> idx;

      if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
        mchunkptr b, p;
        idx += ~smallbits & 1;       /* Uses next bin if idx empty */
        b = smallbin_at(ms, idx);
        p = b->fd;
        assert(chunksize(p) == small_index2size(idx));
        unlink_first_small_chunk(ms, b, p, idx);
        set_inuse_and_pinuse(ms, p, small_index2size(idx));
        mem = chunk2mem(p);
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }

      else if (nb > ms->dvsize) {
        if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
          mchunkptr b, p, r;
          size_t rsize;
          bindex_t i;
          binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
          binmap_t leastbit = least_bit(leftbits);
          compute_bit2idx(leastbit, i);
          b = smallbin_at(ms, i);
          p = b->fd;
          assert(chunksize(p) == small_index2size(i));
          unlink_first_small_chunk(ms, b, p, i);
          rsize = small_index2size(i) - nb;
          /* Fit here cannot be remainderless if 4byte sizes */
          if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE)
            set_inuse_and_pinuse(ms, p, small_index2size(i));
          else {
            set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
            r = chunk_plus_offset(p, nb);
            set_size_and_pinuse_of_free_chunk(r, rsize);
            replace_dv(ms, r, rsize);
          }
          mem = chunk2mem(p);
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }

        else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
          check_malloced_chunk(ms, mem, nb);
          goto postaction;
        }
      }
    }
    else if (bytes >= MAX_REQUEST)
      nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
    else {
      nb = pad_request(bytes);
      if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
        check_malloced_chunk(ms, mem, nb);
        goto postaction;
      }
    }

    if (nb <= ms->dvsize) {
      size_t rsize = ms->dvsize - nb;
      mchunkptr p = ms->dv;
      if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
        mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
        ms->dvsize = rsize;
        set_size_and_pinuse_of_free_chunk(r, rsize);
        set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      }
      else { /* exhaust dv */
        size_t dvs = ms->dvsize;
        ms->dvsize = 0;
        ms->dv = 0;
        set_inuse_and_pinuse(ms, p, dvs);
      }
      mem = chunk2mem(p);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    else if (nb < ms->topsize) { /* Split top */
      size_t rsize = ms->topsize -= nb;
      mchunkptr p = ms->top;
      mchunkptr r = ms->top = chunk_plus_offset(p, nb);
      r->head = rsize | PINUSE_BIT;
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
      mem = chunk2mem(p);
      check_top_chunk(ms, ms->top);
      check_malloced_chunk(ms, mem, nb);
      goto postaction;
    }

    mem = sys_alloc(ms, nb);

  postaction:
    POSTACTION(ms);
    return mem;
  }

  return 0;
}